

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

_func_void_void_ptr * fts3MIBufferAlloc(MatchinfoBuffer *p,u32 **paOut)

{
  u32 *local_28;
  u32 *aOut;
  _func_void_void_ptr *xRet;
  u32 **paOut_local;
  MatchinfoBuffer *p_local;
  
  aOut = (u32 *)0x0;
  if (p->aRef[1] == '\0') {
    p->aRef[1] = '\x01';
    local_28 = (u32 *)&p->field_0x1c;
    aOut = (u32 *)fts3MIBufferFree;
  }
  else if (p->aRef[2] == '\0') {
    p->aRef[2] = '\x01';
    local_28 = p->aMatchinfo + (p->nElem + 2);
    aOut = (u32 *)fts3MIBufferFree;
  }
  else {
    local_28 = (u32 *)sqlite3_malloc64((long)p->nElem << 2);
    if ((local_28 != (u32 *)0x0) && (aOut = (u32 *)sqlite3_free, p->bGlobal != 0)) {
      memcpy(local_28,&p->field_0x1c,(long)p->nElem << 2);
    }
  }
  *paOut = local_28;
  return (_func_void_void_ptr *)aOut;
}

Assistant:

static void (*fts3MIBufferAlloc(MatchinfoBuffer *p, u32 **paOut))(void*){
  void (*xRet)(void*) = 0;
  u32 *aOut = 0;

  if( p->aRef[1]==0 ){
    p->aRef[1] = 1;
    aOut = &p->aMatchinfo[1];
    xRet = fts3MIBufferFree;
  }
  else if( p->aRef[2]==0 ){
    p->aRef[2] = 1;
    aOut = &p->aMatchinfo[p->nElem+2];
    xRet = fts3MIBufferFree;
  }else{
    aOut = (u32*)sqlite3_malloc64(p->nElem * sizeof(u32));
    if( aOut ){
      xRet = sqlite3_free;
      if( p->bGlobal ) memcpy(aOut, &p->aMatchinfo[1], p->nElem*sizeof(u32));
    }
  }

  *paOut = aOut;
  return xRet;
}